

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBlockReader.cpp
# Opt level: O2

void __thiscall IBlockReader::getWord(IBlockReader *this,string *str)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  
  cVar1 = std::istream::get();
  if (cVar1 == '{') {
    cVar1 = (char)str;
    std::__cxx11::string::push_back(cVar1);
    this->m_hasChild = true;
    bVar3 = true;
    while( true ) {
      iVar2 = std::istream::get();
      if ((!bVar3) || (iVar2 = iVar2 << 0x18, iVar2 == -0x1000000)) break;
      std::__cxx11::string::push_back(cVar1);
      if (iVar2 == 0x7d000000) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (iVar2 == 0xa000000) {
          std::__cxx11::string::push_back(cVar1);
          bVar3 = true;
        }
      }
    }
  }
  return;
}

Assistant:

void IBlockReader::getWord(std::string &str) {
    char tempChar;
    int num_3l;

    tempChar=m_ifs->get();
    if(tempChar=='{')
    {
        str+=tempChar;
        m_hasChild= true;
        num_3l=1;

        while ((tempChar=m_ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
}